

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t archive_read_format_zip_read_data_skip_streamable(archive_read *a)

{
  byte bVar1;
  void *pvVar2;
  long lVar3;
  int64_t iVar4;
  char *pcVar5;
  int64_t *in_RCX;
  char *pcVar6;
  wchar_t wVar7;
  ssize_t bytes_avail;
  void *local_38;
  size_t local_30;
  
  pvVar2 = a->format->data;
  iVar4 = __archive_read_consume(a,*(int64_t *)((long)pvVar2 + 0x88));
  *(undefined8 *)((long)pvVar2 + 0x88) = 0;
  wVar7 = L'\xffffffe2';
  if (-1 < iVar4) {
    if (*(char *)((long)pvVar2 + 0xc2) == '\0') {
      lVar3 = *(long *)((long)pvVar2 + 0x90);
      if (((*(byte *)(lVar3 + 0x7e) & 8) == 0) || (0 < *(long *)(lVar3 + 0x28))) {
        iVar4 = __archive_read_consume(a,*(int64_t *)((long)pvVar2 + 0x98));
        wVar7 = (uint)(iVar4 >> 0x3f) & 0xffffffe2;
      }
      else if (*(char *)(lVar3 + 0x80) == '\b') {
        do {
          if (*(char *)((long)pvVar2 + 0xc2) != '\0') goto LAB_0013f8a7;
          wVar7 = zip_read_data_deflate(a,&local_38,&local_30,in_RCX);
        } while (wVar7 == L'\0');
      }
      else {
        pcVar5 = (char *)__archive_read_ahead(a,0x10,(ssize_t *)&local_38);
        while (0xf < (long)local_38) {
          pcVar6 = pcVar5;
          while (pcVar6 <= (char *)((long)local_38 + (long)pcVar5) + -0x10) {
            bVar1 = pcVar6[3];
            if (bVar1 < 0x4b) {
              if (bVar1 == 7) {
                pcVar6 = pcVar6 + 1;
              }
              else {
                if ((((bVar1 == 8) && (pcVar6[2] == '\a')) && (pcVar6[1] == 'K')) &&
                   (*pcVar6 == 'P')) {
                  if ((*(byte *)(*(long *)((long)pvVar2 + 0x90) + 0x82) & 1) == 0) {
                    lVar3 = 0x10 - (long)pcVar5;
                  }
                  else {
                    lVar3 = 0x18 - (long)pcVar5;
                  }
                  __archive_read_consume(a,(int64_t)(pcVar6 + lVar3));
                  goto LAB_0013f8a7;
                }
LAB_0013f985:
                pcVar6 = pcVar6 + 4;
              }
            }
            else if (bVar1 == 0x50) {
              pcVar6 = pcVar6 + 3;
            }
            else {
              if (bVar1 != 0x4b) goto LAB_0013f985;
              pcVar6 = pcVar6 + 2;
            }
          }
          __archive_read_consume(a,(long)pcVar6 - (long)pcVar5);
          pcVar5 = (char *)__archive_read_ahead(a,0x10,(ssize_t *)&local_38);
        }
        archive_set_error(&a->archive,0x54,"Truncated ZIP file data");
      }
    }
    else {
LAB_0013f8a7:
      wVar7 = L'\0';
    }
  }
  return wVar7;
}

Assistant:

static int
archive_read_format_zip_read_data_skip_streamable(struct archive_read *a)
{
	struct zip *zip;
	int64_t bytes_skipped;

	zip = (struct zip *)(a->format->data);
	bytes_skipped = __archive_read_consume(a, zip->unconsumed);
	zip->unconsumed = 0;
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	/* If we've already read to end of data, we're done. */
	if (zip->end_of_entry)
		return (ARCHIVE_OK);

	/* So we know we're streaming... */
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)
	    || zip->entry->compressed_size > 0) {
		/* We know the compressed length, so we can just skip. */
		bytes_skipped = __archive_read_consume(a, zip->entry_bytes_remaining);
		if (bytes_skipped < 0)
			return (ARCHIVE_FATAL);
		return (ARCHIVE_OK);
	}

	/* We're streaming and we don't know the length. */
	/* If the body is compressed and we know the format, we can
	 * find an exact end-of-entry by decompressing it. */
	switch (zip->entry->compression) {
#ifdef HAVE_ZLIB_H
	case 8: /* Deflate compression. */
		while (!zip->end_of_entry) {
			int64_t offset = 0;
			const void *buff = NULL;
			size_t size = 0;
			int r;
			r =  zip_read_data_deflate(a, &buff, &size, &offset);
			if (r != ARCHIVE_OK)
				return (r);
		}
		return ARCHIVE_OK;
#endif
	default: /* Uncompressed or unknown. */
		/* Scan for a PK\007\010 signature. */
		for (;;) {
			const char *p, *buff;
			ssize_t bytes_avail;
			buff = __archive_read_ahead(a, 16, &bytes_avail);
			if (bytes_avail < 16) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Truncated ZIP file data");
				return (ARCHIVE_FATAL);
			}
			p = buff;
			while (p <= buff + bytes_avail - 16) {
				if (p[3] == 'P') { p += 3; }
				else if (p[3] == 'K') { p += 2; }
				else if (p[3] == '\007') { p += 1; }
				else if (p[3] == '\010' && p[2] == '\007'
				    && p[1] == 'K' && p[0] == 'P') {
					if (zip->entry->flags & LA_USED_ZIP64)
						__archive_read_consume(a, p - buff + 24);
					else
						__archive_read_consume(a, p - buff + 16);
					return ARCHIVE_OK;
				} else { p += 4; }
			}
			__archive_read_consume(a, p - buff);
		}
	}
}